

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

string * __thiscall
cfd::core::ScriptElement::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptElement *this)

{
  size_t sVar1;
  allocator *paVar2;
  allocator local_12;
  allocator local_11;
  
  if (this->type_ == kElementNumber) {
    ::std::__cxx11::to_string(__return_storage_ptr__,this->value_);
  }
  else {
    if (this->type_ == kElementBinary) {
      sVar1 = ByteData::GetDataSize(&this->binary_data_);
      if (sVar1 != 0) {
        ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&this->binary_data_);
        return __return_storage_ptr__;
      }
      paVar2 = &local_11;
    }
    else {
      if ((this->op_code_).data_type_ != kOpInvalidOpCode) {
        ScriptOperator::ToString_abi_cxx11_(__return_storage_ptr__,&this->op_code_);
        return __return_storage_ptr__;
      }
      paVar2 = &local_12;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptElement::ToString() const {
  switch (type_) {
    case kElementBinary:
      if (binary_data_.GetDataSize() == 0) {
        return "";
      } else {
        return binary_data_.GetHex();
      }
    case kElementNumber: {
      return std::to_string(value_);
    }
    case kElementOpCode:
    default: {
      if (op_code_.GetDataType() != kOpInvalidOpCode) {
        return op_code_.ToString();
      }
      break;
    }
  }
  return "";
}